

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumMassMult(void *arkode_mem,long *nmvevals)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassMult",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmvevals = local_18->nmtimes;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassMult(void *arkode_mem, long int *nmvevals)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassMult",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmvevals = arkls_mem->nmtimes;
  return(ARKLS_SUCCESS);
}